

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_numbox.c
# Opt level: O3

void my_numbox_calc_fontwidth(t_my_numbox *x)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  uVar2 = (uint)(x->x_gui).x_fsf & 0x3f;
  iVar4 = 0x1f;
  if (uVar2 == 2) {
    iVar4 = 0x19;
  }
  iVar3 = 0x1b;
  if (uVar2 != 1) {
    iVar3 = iVar4;
  }
  iVar4 = (x->x_gui).x_h;
  iVar1 = ((x->x_gui).x_glist)->gl_zoom;
  (x->x_gui).x_w =
       ((int)(CONCAT44(iVar4 - (iVar4 >> 0x1f) >> 0x1f,iVar4 / 2) / (long)iVar1) +
        (x->x_numwidth * (x->x_gui).x_fontsize * iVar3) / 0x24 + 4) * iVar1;
  return;
}

Assistant:

void my_numbox_calc_fontwidth(t_my_numbox *x)
{
    int w, f = 31;

    if(x->x_gui.x_fsf.x_font_style == 1)
        f = 27;
    else if(x->x_gui.x_fsf.x_font_style == 2)
        f = 25;

    w = x->x_gui.x_fontsize * f * x->x_numwidth;
    w /= 36;
    x->x_gui.x_w = (w + (x->x_gui.x_h/2)/IEMGUI_ZOOM(x) + 4) * IEMGUI_ZOOM(x);
}